

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtpaths.cpp
# Opt level: O3

StringEnum * parseLocationOrError(QString *locationString)

{
  char16_t *pcVar1;
  long lVar2;
  char *pcVar3;
  long lVar4;
  char cVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long in_FS_OFFSET;
  QStringView QVar9;
  QLatin1String QVar10;
  QArrayDataPointer<char16_t> local_60;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar1 = (locationString->d).ptr;
  lVar2 = (locationString->d).size;
  lVar8 = 0;
  while( true ) {
    pcVar3 = *(char **)((long)&lookupTableData[0].stringvalue + lVar8);
    if (pcVar3 == (char *)0x0) {
      lVar6 = 0;
    }
    else {
      lVar7 = -1;
      do {
        lVar6 = lVar7 + 1;
        lVar4 = lVar7 + 1;
        lVar7 = lVar6;
      } while (pcVar3[lVar4] != '\0');
    }
    if ((lVar2 == lVar6) &&
       (QVar9.m_data = pcVar1, QVar9.m_size = lVar2, QVar10.m_data = pcVar3, QVar10.m_size = lVar2,
       cVar5 = QtPrivate::equalStrings(QVar9,QVar10), cVar5 != '\0')) break;
    lVar8 = lVar8 + 0x10;
    if (lVar8 == 0x170) {
      local_60.d = (Data *)0x0;
      local_60.ptr = (char16_t *)0x0;
      local_48.d.d = (Data *)0x0;
      local_48.d.ptr = L"Unknown location: %1";
      local_60.size = 0;
      local_48.d.size = 0x14;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
      QString::arg<QString,_true>((QString *)&local_60,&local_48,locationString,0,(QChar)0x20);
      error((QString *)&local_60);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return (StringEnum *)((long)&lookupTableData[0].stringvalue + lVar8);
}

Assistant:

static const StringEnum &parseLocationOrError(const QString &locationString)
{
    for (const StringEnum &se : lookupTableData)
        if (locationString == QLatin1StringView(se.stringvalue))
            return se;

    QString message = QStringLiteral("Unknown location: %1");
    error(message.arg(locationString));
}